

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O0

void __thiscall QLineEditPrivate::handleWindowActivate(QLineEditPrivate *this)

{
  bool bVar1;
  QWidgetLineControl *this_00;
  QLineEditPrivate *in_RDI;
  QLineEdit *q;
  
  this_00 = (QWidgetLineControl *)q_func(in_RDI);
  bVar1 = QWidget::hasFocus(&q->super_QWidget);
  if ((!bVar1) && (bVar1 = QWidgetLineControl::hasSelectedText(this_00), bVar1)) {
    QWidgetLineControl::deselect(this_00);
  }
  return;
}

Assistant:

void QLineEditPrivate::handleWindowActivate()
{
    Q_Q(QLineEdit);
    if (!q->hasFocus() && control->hasSelectedText())
        control->deselect();
}